

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

upb_Map * upb_Map_New(upb_Arena *a,upb_CType key_type,upb_CType value_type)

{
  size_t key_size;
  size_t value_size;
  upb_Map *puVar1;
  upb_CType value_type_local;
  upb_CType key_type_local;
  upb_Arena *a_local;
  
  key_size = _upb_Map_CTypeSize(key_type);
  value_size = _upb_Map_CTypeSize(value_type);
  puVar1 = _upb_Map_New(a,key_size,value_size);
  return puVar1;
}

Assistant:

upb_Map* _upb_Map_New(upb_Arena* a, size_t key_size, size_t value_size) {
  upb_Map* map = upb_Arena_Malloc(a, sizeof(upb_Map));
  if (!map) return NULL;

  if (key_size <= sizeof(uintptr_t) && key_size != UPB_MAPTYPE_STRING) {
    if (!upb_inttable_init(&map->t.inttable, a)) return NULL;
    map->UPB_PRIVATE(is_strtable) = false;
  } else {
    if (!upb_strtable_init(&map->t.strtable, 4, a)) return NULL;
    map->UPB_PRIVATE(is_strtable) = true;
  }
  map->key_size = key_size;
  map->val_size = value_size;
  map->UPB_PRIVATE(is_frozen) = false;

  return map;
}